

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O2

void __thiscall
duckdb::MultiFileReader::FinalizeBind
          (MultiFileReader *this,MultiFileReaderData *reader_data,MultiFileOptions *file_options,
          MultiFileReaderBindData *options,
          vector<duckdb::MultiFileColumnDefinition,_true> *global_columns,
          vector<duckdb::ColumnIndex,_true> *global_column_ids,ClientContext *context,
          optional_ptr<duckdb::MultiFileReaderGlobalState,_true> global_state)

{
  column_t column_id;
  bool bVar1;
  BaseFileReader *pBVar2;
  const_reference pvVar3;
  mapped_type *pmVar4;
  MultiFileConstantMap *this_00;
  const_reference pvVar5;
  idx_t iVar6;
  iterator iVar7;
  mapped_type *value_00;
  idx_t col_idx;
  ulong uVar8;
  pointer __k;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  partitions;
  case_insensitive_map_t<idx_t> name_map;
  Value value;
  MultiFileGlobalIndex local_140;
  BaseFileReader *local_138;
  MultiFileOptions *local_130;
  MultiFileReaderData *local_128;
  vector<duckdb::MultiFileColumnDefinition,_true> *local_120;
  column_t local_118;
  LogicalType local_110;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  string local_c8;
  undefined8 *local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  Value local_70;
  
  local_120 = global_columns;
  pBVar2 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(&reader_data->reader);
  local_128 = reader_data;
  local_138 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(&reader_data->reader);
  local_a8 = &uStack_78;
  local_a0 = 1;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0x3f800000;
  local_80 = 0;
  uStack_78 = 0;
  local_130 = file_options;
  if (file_options->union_by_name == true) {
    for (uVar8 = 0;
        uVar8 < (ulong)(((long)(pBVar2->columns).
                               super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                               .
                               super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pBVar2->columns).
                              super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                              .
                              super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x98); uVar8 = uVar8 + 1)
    {
      pvVar3 = vector<duckdb::MultiFileColumnDefinition,_true>::get<true>(&pBVar2->columns,uVar8);
      pmVar4 = ::std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&local_a8,&pvVar3->name);
      *pmVar4 = uVar8;
    }
  }
  local_138 = (BaseFileReader *)&local_138->file;
  this_00 = &local_128->constant_map;
  uVar8 = 0;
  local_118 = 0x8000000000000002;
  do {
    if ((ulong)((long)(global_column_ids->
                      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(global_column_ids->
                      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 5) <= uVar8) {
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&local_a8);
      return;
    }
    local_140.index = uVar8;
    pvVar5 = vector<duckdb::ColumnIndex,_true>::get<true>(global_column_ids,uVar8);
    column_id = pvVar5->index;
    if ((options->filename_idx).index == 0xffffffffffffffff) {
      if (column_id != 0x8000000000000002) goto LAB_008cc607;
LAB_008cc5c8:
      pBVar2 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(&local_128->reader);
      iVar6 = optional_idx::GetIndex(&pBVar2->file_list_idx);
      Value::UBIGINT(&local_70,iVar6);
      ::std::vector<duckdb::MultiFileConstantEntry,std::allocator<duckdb::MultiFileConstantEntry>>::
      emplace_back<duckdb::MultiFileGlobalIndex&,duckdb::Value>
                ((vector<duckdb::MultiFileConstantEntry,std::allocator<duckdb::MultiFileConstantEntry>>
                  *)this_00,&local_140,&local_70);
      Value::~Value(&local_70);
    }
    else {
      iVar6 = optional_idx::GetIndex(&options->filename_idx);
      if ((column_id == 0x8000000000000000) || (column_id == iVar6)) {
        ::std::__cxx11::string::string((string *)&local_c8,(string *)local_138);
        Value::Value(&local_70,&local_c8);
        ::std::vector<duckdb::MultiFileConstantEntry,std::allocator<duckdb::MultiFileConstantEntry>>
        ::emplace_back<duckdb::MultiFileGlobalIndex&,duckdb::Value>
                  ((vector<duckdb::MultiFileConstantEntry,std::allocator<duckdb::MultiFileConstantEntry>>
                    *)this_00,&local_140,&local_70);
        Value::~Value(&local_70);
        ::std::__cxx11::string::~string((string *)&local_c8);
      }
      else {
        if (column_id == local_118) goto LAB_008cc5c8;
LAB_008cc607:
        bVar1 = IsVirtualColumn(column_id);
        if (!bVar1) {
          if ((options->hive_partitioning_indexes).
              super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
              .
              super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (options->hive_partitioning_indexes).
              super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
              .
              super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            HivePartitioning::Parse
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_f8,(string *)local_138);
            for (__k = (options->hive_partitioning_indexes).
                       super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                       .
                       super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                __k != (options->hive_partitioning_indexes).
                       super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                       .
                       super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                       ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
              if (column_id == __k->index) {
                value_00 = ::std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&local_f8,&__k->value);
                MultiFileOptions::GetHivePartitionValue
                          (&local_70,local_130,value_00,&__k->value,context);
                ::std::
                vector<duckdb::MultiFileConstantEntry,std::allocator<duckdb::MultiFileConstantEntry>>
                ::emplace_back<duckdb::MultiFileGlobalIndex&,duckdb::Value&>
                          ((vector<duckdb::MultiFileConstantEntry,std::allocator<duckdb::MultiFileConstantEntry>>
                            *)this_00,&local_140,&local_70);
                Value::~Value(&local_70);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~_Rb_tree(&local_f8);
                goto LAB_008cc71e;
              }
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree(&local_f8);
          }
          if (local_130->union_by_name == true) {
            pvVar3 = vector<duckdb::MultiFileColumnDefinition,_true>::get<true>(local_120,column_id)
            ;
            iVar7 = ::std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)&local_a8,&pvVar3->name);
            if (iVar7.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                ._M_cur == (__node_type *)0x0) {
              LogicalType::LogicalType(&local_110,&pvVar3->type);
              Value::Value(&local_70,&local_110);
              ::std::
              vector<duckdb::MultiFileConstantEntry,std::allocator<duckdb::MultiFileConstantEntry>>
              ::emplace_back<duckdb::MultiFileGlobalIndex&,duckdb::Value>
                        ((vector<duckdb::MultiFileConstantEntry,std::allocator<duckdb::MultiFileConstantEntry>>
                          *)this_00,&local_140,&local_70);
              Value::~Value(&local_70);
              LogicalType::~LogicalType(&local_110);
            }
          }
        }
      }
    }
LAB_008cc71e:
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void MultiFileReader::FinalizeBind(MultiFileReaderData &reader_data, const MultiFileOptions &file_options,
                                   const MultiFileReaderBindData &options,
                                   const vector<MultiFileColumnDefinition> &global_columns,
                                   const vector<ColumnIndex> &global_column_ids, ClientContext &context,
                                   optional_ptr<MultiFileReaderGlobalState> global_state) {

	// create a map of name -> column index
	auto &local_columns = reader_data.reader->GetColumns();
	auto &filename = reader_data.reader->GetFileName();
	case_insensitive_map_t<idx_t> name_map;
	if (file_options.union_by_name) {
		for (idx_t col_idx = 0; col_idx < local_columns.size(); col_idx++) {
			auto &column = local_columns[col_idx];
			name_map[column.name] = col_idx;
		}
	}
	for (idx_t i = 0; i < global_column_ids.size(); i++) {
		auto global_idx = MultiFileGlobalIndex(i);
		auto &col_id = global_column_ids[i];
		auto column_id = col_id.GetPrimaryIndex();
		if ((options.filename_idx.IsValid() && column_id == options.filename_idx.GetIndex()) ||
		    column_id == COLUMN_IDENTIFIER_FILENAME) {
			// filename
			reader_data.constant_map.Add(global_idx, Value(filename));
			continue;
		}
		if (column_id == COLUMN_IDENTIFIER_FILE_INDEX) {
			// filename
			reader_data.constant_map.Add(global_idx, Value::UBIGINT(reader_data.reader->file_list_idx.GetIndex()));
			continue;
		}
		if (IsVirtualColumn(column_id)) {
			continue;
		}
		if (!options.hive_partitioning_indexes.empty()) {
			// hive partition constants
			auto partitions = HivePartitioning::Parse(filename);
			D_ASSERT(partitions.size() == options.hive_partitioning_indexes.size());
			bool found_partition = false;
			for (auto &entry : options.hive_partitioning_indexes) {
				if (column_id == entry.index) {
					Value value = file_options.GetHivePartitionValue(partitions[entry.value], entry.value, context);
					reader_data.constant_map.Add(global_idx, value);
					found_partition = true;
					break;
				}
			}
			if (found_partition) {
				continue;
			}
		}
		if (file_options.union_by_name) {
			auto &column = global_columns[column_id];
			auto &name = column.name;
			auto &type = column.type;

			auto entry = name_map.find(name);
			bool not_present_in_file = entry == name_map.end();
			if (not_present_in_file) {
				// we need to project a column with name \"global_name\" - but it does not exist in the current file
				// push a NULL value of the specified type
				reader_data.constant_map.Add(global_idx, Value(type));
				continue;
			}
		}
	}
}